

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_jpg_core(stbi__write_context *s,int width,int height,int comp,void *data,int quality)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  stbi__write_context *psVar21;
  undefined8 uVar22;
  undefined4 extraout_var;
  float *pfVar23;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint uVar24;
  ulong uVar25;
  uchar *puVar26;
  float *pfVar27;
  int iVar28;
  undefined4 in_register_00000014;
  long lVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  byte *pbVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int bitCnt;
  int bitBuf;
  uint local_10f8;
  uint local_10f4;
  stbi__write_context *local_10f0;
  ulong local_10e8;
  long local_10e0;
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined8 local_10c0;
  uchar UVTable [64];
  uchar YTable [64];
  float fdtbl_Y [64];
  float fdtbl_UV [64];
  float Y [256];
  float subV [64];
  float subU [64];
  float U [256];
  float V [256];
  
  local_10d8 = CONCAT44(in_register_00000014,height);
  iVar35 = 0;
  iVar28 = 0;
  if ((((0xfffffffb < comp - 5U) && (iVar28 = iVar35, height != 0)) && (width != 0)) &&
     (data != (void *)0x0)) {
    local_10f4 = 0x5a;
    if (quality != 0) {
      local_10f4 = quality;
    }
    uVar24 = 100;
    if ((int)local_10f4 < 100) {
      uVar24 = local_10f4;
    }
    uVar25 = 1;
    if (1 < (int)uVar24) {
      uVar25 = (ulong)uVar24;
    }
    if ((int)local_10f4 < 0x32) {
      iVar28 = (int)(5000 / uVar25);
    }
    else {
      iVar28 = (int)uVar25 * -2 + 200;
    }
    puVar26 = "";
    lVar29 = 0;
    do {
      iVar35 = (*(int *)((long)stbi_write_jpg_core::YQT + lVar29) * iVar28 + 0x32) / 100;
      if (0xfe < iVar35) {
        iVar35 = 0xff;
      }
      if (iVar35 < 2) {
        iVar35 = 1;
      }
      bVar4 = *puVar26;
      YTable[bVar4] = (uchar)iVar35;
      iVar35 = (*(int *)((long)stbi_write_jpg_core::UVQT + lVar29) * iVar28 + 0x32) / 100;
      if (0xfe < iVar35) {
        iVar35 = 0xff;
      }
      if (iVar35 < 2) {
        iVar35 = 1;
      }
      UVTable[bVar4] = (uchar)iVar35;
      lVar29 = lVar29 + 4;
      puVar26 = puVar26 + 1;
    } while (lVar29 != 0x100);
    local_10e0 = 0;
    uVar25 = 0;
    do {
      local_10e8 = uVar25;
      lVar29 = (long)(int)local_10e0;
      local_10e0 = lVar29 + 8;
      fVar39 = stbi_write_jpg_core::aasf[local_10e8];
      pbVar33 = "" + lVar29 + 3;
      lVar38 = 0;
      do {
        bVar4 = pbVar33[-3];
        bVar5 = pbVar33[-2];
        bVar6 = pbVar33[-1];
        bVar7 = *pbVar33;
        auVar8[0xc] = YTable[bVar7];
        auVar8._0_12_ = ZEXT812(0);
        auVar9._10_3_ = auVar8._10_3_;
        auVar9._0_10_ = (unkuint10)YTable[bVar6] << 0x40;
        fVar40 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38);
        fVar41 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38 + 4);
        fVar12 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38 + 8);
        fVar13 = *(float *)((long)stbi_write_jpg_core::aasf + lVar38 + 0xc);
        auVar43._0_4_ = (float)YTable[bVar4] * fVar39 * fVar40;
        auVar43._4_4_ = (float)YTable[bVar5] * fVar39 * fVar41;
        auVar43._8_4_ = (float)auVar9._8_4_ * fVar39 * fVar12;
        auVar43._12_4_ = (float)(uint3)(auVar8._10_3_ >> 0x10) * fVar39 * fVar13;
        auVar43 = divps(_DAT_0024a010,auVar43);
        *(undefined1 (*) [16])((long)fdtbl_Y + lVar38 + lVar29 * 4) = auVar43;
        auVar10[0xc] = UVTable[bVar7];
        auVar10._0_12_ = ZEXT812(0);
        auVar11._10_3_ = auVar10._10_3_;
        auVar11._0_10_ = (unkuint10)UVTable[bVar6] << 0x40;
        auVar42._0_4_ = (float)UVTable[bVar4] * fVar39 * fVar40;
        auVar42._4_4_ = (float)UVTable[bVar5] * fVar39 * fVar41;
        auVar42._8_4_ = (float)auVar11._8_4_ * fVar39 * fVar12;
        auVar42._12_4_ = (float)(uint3)(auVar10._10_3_ >> 0x10) * fVar39 * fVar13;
        auVar43 = divps(_DAT_0024a010,auVar42);
        *(undefined1 (*) [16])((long)fdtbl_UV + lVar38 + lVar29 * 4) = auVar43;
        lVar38 = lVar38 + 0x10;
        pbVar33 = pbVar33 + 4;
      } while (lVar38 != 0x20);
      uVar25 = local_10e8 + 1;
    } while (local_10e8 + 1 != 8);
    Y[0] = 1.0156891e-28;
    Y[1]._0_1_ = 8;
    Y[1]._1_1_ = (undefined1)((uint)height >> 8);
    Y[1]._2_1_ = (undefined1)height;
    Y[1]._3_1_ = (undefined1)((uint)width >> 8);
    Y[2]._0_1_ = (undefined1)width;
    Y[2]._1_2_ = 0x103;
    Y[2]._3_1_ = 0x11;
    if ((int)local_10f4 < 0x5b) {
      Y[2]._3_1_ = 0x22;
    }
    Y[3] = 2.663373e-38;
    Y[4] = -1.7155874e+38;
    Y[5] = 1.4877984e-38;
    local_10f0 = s;
    (*s->func)(s->context,stbi_write_jpg_core::head0,0x19);
    (*s->func)(s->context,YTable,0x40);
    U[0]._0_1_ = 1;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,UVTable,0x40);
    (*s->func)(s->context,Y,0x18);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    U[0]._0_1_ = 0x10;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"\x01\x02\x03",0xa2);
    U[0]._0_1_ = 1;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xc);
    U[0]._0_1_ = 0x11;
    (*s->func)(s->context,U,1);
    (*s->func)(s->context,"",0x10);
    (*s->func)(s->context,"",0xa2);
    (*s->func)(s->context,stbi_write_jpg_core::head2,0xe);
    uVar25 = (ulong)(2 < comp);
    bitBuf = 0;
    bitCnt = 0;
    iVar28 = (int)local_10d8;
    if ((int)local_10f4 < 0x5b) {
      if (0 < iVar28) {
        local_10f4 = iVar28 - 1;
        local_10d0 = 0;
        local_10e0 = CONCAT44(local_10e0._4_4_,0x10);
        local_10c8 = 0;
        uVar22 = 0;
        local_10f8 = 0;
        do {
          if (0 < width) {
            local_10e8 = local_10e8 & 0xffffffff00000000;
            do {
              iVar28 = 0;
              uVar24 = local_10f8;
              do {
                uVar31 = local_10f4;
                if ((int)uVar24 < (int)local_10d8) {
                  uVar31 = uVar24;
                }
                uVar30 = local_10f4 - uVar31;
                if (stbi__flip_vertically_on_write == 0) {
                  uVar30 = uVar31;
                }
                lVar29 = (long)iVar28;
                iVar32 = 0;
                iVar35 = (int)local_10e8;
                do {
                  iVar37 = width + -1;
                  if (iVar35 < width) {
                    iVar37 = iVar35;
                  }
                  lVar38 = (long)(int)((iVar37 + uVar30 * width) * comp);
                  fVar39 = (float)*(byte *)((long)data + lVar38);
                  fVar41 = (float)*(byte *)((long)data + lVar38 + uVar25);
                  fVar40 = (float)*(byte *)((long)data + lVar38 + uVar25 * 2);
                  Y[lVar29] = fVar40 * 0.114 + fVar39 * 0.299 + fVar41 * 0.587 + -128.0;
                  U[lVar29] = fVar40 * 0.5 + fVar39 * -0.16874 + fVar41 * -0.33126;
                  V[lVar29] = fVar40 * -0.08131 + fVar39 * 0.5 + fVar41 * -0.41869;
                  iVar35 = iVar35 + 1;
                  lVar29 = lVar29 + 1;
                  iVar32 = iVar32 + -1;
                } while (iVar32 != -0x10);
                iVar28 = iVar28 + 0x10;
                uVar24 = uVar24 + 1;
              } while (uVar24 != (uint)local_10e0);
              local_10c0 = uVar22;
              iVar28 = stbiw__jpg_processDU
                                 (local_10f0,&bitBuf,&bitCnt,Y,0x10,fdtbl_Y,(int)local_10d0,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              iVar28 = stbiw__jpg_processDU
                                 (local_10f0,&bitBuf,&bitCnt,Y + 8,0x10,fdtbl_Y,iVar28,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              iVar28 = stbiw__jpg_processDU
                                 (local_10f0,&bitBuf,&bitCnt,Y + 0x80,0x10,fdtbl_Y,iVar28,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              iVar28 = stbiw__jpg_processDU
                                 (local_10f0,&bitBuf,&bitCnt,Y + 0x88,0x10,fdtbl_Y,iVar28,
                                  stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
              local_10d0 = CONCAT44(extraout_var,iVar28);
              pfVar23 = U + 0x10;
              pfVar27 = V + 0x10;
              lVar38 = 0;
              lVar29 = 0;
              do {
                lVar34 = (long)(int)lVar29;
                lVar29 = lVar34 + 8;
                lVar36 = 0;
                do {
                  pfVar1 = (float *)((long)pfVar23 + lVar36 * 2 + -0x40);
                  fVar39 = pfVar1[2];
                  fVar40 = pfVar1[3];
                  pfVar2 = (float *)((long)pfVar23 + lVar36 * 2 + -0x30);
                  fVar41 = *pfVar2;
                  fVar12 = pfVar2[1];
                  fVar13 = pfVar2[2];
                  fVar14 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar23 + lVar36 * 2);
                  fVar15 = pfVar2[2];
                  fVar16 = pfVar2[3];
                  pfVar3 = (float *)((long)pfVar23 + lVar36 * 2 + 0x10);
                  fVar17 = *pfVar3;
                  fVar18 = pfVar3[1];
                  fVar19 = pfVar3[2];
                  fVar20 = pfVar3[3];
                  pfVar3 = (float *)((long)subU + lVar36 + lVar34 * 4);
                  *pfVar3 = (pfVar2[1] + *pfVar2 + pfVar1[1] + *pfVar1) * 0.25;
                  pfVar3[1] = (fVar16 + fVar15 + fVar40 + fVar39) * 0.25;
                  pfVar3[2] = (fVar18 + fVar17 + fVar12 + fVar41) * 0.25;
                  pfVar3[3] = (fVar20 + fVar19 + fVar14 + fVar13) * 0.25;
                  pfVar1 = (float *)((long)pfVar27 + lVar36 * 2 + -0x40);
                  fVar39 = pfVar1[2];
                  fVar40 = pfVar1[3];
                  pfVar2 = (float *)((long)pfVar27 + lVar36 * 2 + -0x30);
                  fVar41 = *pfVar2;
                  fVar12 = pfVar2[1];
                  fVar13 = pfVar2[2];
                  fVar14 = pfVar2[3];
                  pfVar2 = (float *)((long)pfVar27 + lVar36 * 2);
                  fVar15 = pfVar2[2];
                  fVar16 = pfVar2[3];
                  auVar43 = *(undefined1 (*) [16])((long)pfVar27 + lVar36 * 2 + 0x10);
                  pfVar3 = (float *)((long)subV + lVar36 + lVar34 * 4);
                  *pfVar3 = (pfVar2[1] + *pfVar2 + pfVar1[1] + *pfVar1) * 0.25;
                  pfVar3[1] = (fVar16 + fVar15 + fVar40 + fVar39) * 0.25;
                  pfVar3[2] = (auVar43._4_4_ + auVar43._0_4_ + fVar12 + fVar41) * 0.25;
                  pfVar3[3] = (auVar43._12_4_ + auVar43._8_4_ + fVar14 + fVar13) * 0.25;
                  lVar36 = lVar36 + 0x10;
                } while (lVar36 != 0x20);
                lVar38 = lVar38 + 1;
                pfVar27 = pfVar27 + 0x20;
                pfVar23 = pfVar23 + 0x20;
              } while (lVar38 != 8);
              iVar28 = stbiw__jpg_processDU
                                 (local_10f0,&bitBuf,&bitCnt,subU,8,fdtbl_UV,(int)local_10c8,
                                  stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
              local_10c8 = CONCAT44(extraout_var_00,iVar28);
              iVar28 = stbiw__jpg_processDU
                                 (local_10f0,&bitBuf,&bitCnt,subV,8,fdtbl_UV,(int)local_10c0,
                                  stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
              uVar22 = CONCAT44(extraout_var_01,iVar28);
              iVar28 = (int)local_10e8 + 0x10;
              local_10e8 = CONCAT44(local_10e8._4_4_,iVar28);
            } while (iVar28 < width);
          }
          local_10f8 = local_10f8 + 0x10;
          local_10e0 = CONCAT44(local_10e0._4_4_,(uint)local_10e0 + 0x10);
        } while ((int)local_10f8 < (int)local_10d8);
      }
    }
    else if (0 < iVar28) {
      local_10f4 = iVar28 - 1;
      local_10c8 = 0;
      local_10e0 = CONCAT44(local_10e0._4_4_,8);
      local_10d0 = 0;
      uVar22 = 0;
      local_10f8 = 0;
      do {
        if (0 < width) {
          local_10e8 = local_10e8 & 0xffffffff00000000;
          do {
            iVar28 = 0;
            uVar24 = local_10f8;
            do {
              uVar31 = local_10f4;
              if ((int)uVar24 < (int)local_10d8) {
                uVar31 = uVar24;
              }
              uVar30 = local_10f4 - uVar31;
              if (stbi__flip_vertically_on_write == 0) {
                uVar30 = uVar31;
              }
              lVar29 = (long)iVar28;
              iVar32 = 0;
              iVar35 = (int)local_10e8;
              do {
                iVar37 = width + -1;
                if (iVar35 < width) {
                  iVar37 = iVar35;
                }
                lVar38 = (long)(int)((iVar37 + uVar30 * width) * comp);
                fVar39 = (float)*(byte *)((long)data + lVar38);
                fVar41 = (float)*(byte *)((long)data + lVar38 + uVar25);
                fVar40 = (float)*(byte *)((long)data + lVar38 + uVar25 * 2);
                Y[lVar29] = fVar40 * 0.114 + fVar39 * 0.299 + fVar41 * 0.587 + -128.0;
                U[lVar29] = fVar40 * 0.5 + fVar39 * -0.16874 + fVar41 * -0.33126;
                V[lVar29] = fVar40 * -0.08131 + fVar39 * 0.5 + fVar41 * -0.41869;
                iVar35 = iVar35 + 1;
                lVar29 = lVar29 + 1;
                iVar32 = iVar32 + -1;
              } while (iVar32 != -8);
              iVar28 = iVar28 + 8;
              uVar24 = uVar24 + 1;
            } while (uVar24 != (uint)local_10e0);
            local_10c0 = uVar22;
            iVar28 = stbiw__jpg_processDU
                               (local_10f0,&bitBuf,&bitCnt,Y,8,fdtbl_Y,(int)local_10c8,
                                stbi_write_jpg_core::YDC_HT,stbi_write_jpg_core::YAC_HT);
            local_10c8 = CONCAT44(extraout_var_02,iVar28);
            iVar28 = stbiw__jpg_processDU
                               (local_10f0,&bitBuf,&bitCnt,U,8,fdtbl_UV,(int)local_10d0,
                                stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
            local_10d0 = CONCAT44(extraout_var_03,iVar28);
            iVar28 = stbiw__jpg_processDU
                               (local_10f0,&bitBuf,&bitCnt,V,8,fdtbl_UV,(int)local_10c0,
                                stbi_write_jpg_core::UVDC_HT,stbi_write_jpg_core::UVAC_HT);
            uVar22 = CONCAT44(extraout_var_04,iVar28);
            iVar28 = (int)local_10e8 + 8;
            local_10e8 = CONCAT44(local_10e8._4_4_,iVar28);
          } while (iVar28 < width);
        }
        local_10f8 = local_10f8 + 8;
        local_10e0 = CONCAT44(local_10e0._4_4_,(uint)local_10e0 + 8);
      } while ((int)local_10f8 < (int)local_10d8);
    }
    psVar21 = local_10f0;
    stbiw__jpg_writeBits(local_10f0,&bitBuf,&bitCnt,stbi_write_jpg_core::fillBits);
    Y[0] = (float)CONCAT31(Y[0]._1_3_,0xff);
    iVar28 = 1;
    (*psVar21->func)(psVar21->context,Y,1);
    Y[0] = (float)CONCAT31(Y[0]._1_3_,0xd9);
    (*psVar21->func)(psVar21->context,Y,1);
  }
  return iVar28;
}

Assistant:

static int stbi_write_jpg_core(stbi__write_context *s, int width, int height, int comp, const void* data, int quality) {
   // Constants that don't pollute global namespace
   static const unsigned char std_dc_luminance_nrcodes[] = {0,0,1,5,1,1,1,1,1,1,0,0,0,0,0,0,0};
   static const unsigned char std_dc_luminance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_luminance_nrcodes[] = {0,0,2,1,3,3,2,4,3,5,5,4,4,0,0,1,0x7d};
   static const unsigned char std_ac_luminance_values[] = {
      0x01,0x02,0x03,0x00,0x04,0x11,0x05,0x12,0x21,0x31,0x41,0x06,0x13,0x51,0x61,0x07,0x22,0x71,0x14,0x32,0x81,0x91,0xa1,0x08,
      0x23,0x42,0xb1,0xc1,0x15,0x52,0xd1,0xf0,0x24,0x33,0x62,0x72,0x82,0x09,0x0a,0x16,0x17,0x18,0x19,0x1a,0x25,0x26,0x27,0x28,
      0x29,0x2a,0x34,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,0x59,
      0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x83,0x84,0x85,0x86,0x87,0x88,0x89,
      0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,0xb5,0xb6,
      0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,0xe1,0xe2,
      0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf1,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   static const unsigned char std_dc_chrominance_nrcodes[] = {0,0,3,1,1,1,1,1,1,1,1,1,0,0,0,0,0};
   static const unsigned char std_dc_chrominance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_chrominance_nrcodes[] = {0,0,2,1,2,4,4,3,4,7,5,4,4,0,1,2,0x77};
   static const unsigned char std_ac_chrominance_values[] = {
      0x00,0x01,0x02,0x03,0x11,0x04,0x05,0x21,0x31,0x06,0x12,0x41,0x51,0x07,0x61,0x71,0x13,0x22,0x32,0x81,0x08,0x14,0x42,0x91,
      0xa1,0xb1,0xc1,0x09,0x23,0x33,0x52,0xf0,0x15,0x62,0x72,0xd1,0x0a,0x16,0x24,0x34,0xe1,0x25,0xf1,0x17,0x18,0x19,0x1a,0x26,
      0x27,0x28,0x29,0x2a,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,
      0x59,0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x82,0x83,0x84,0x85,0x86,0x87,
      0x88,0x89,0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,
      0xb5,0xb6,0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,
      0xe2,0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   // Huffman tables
   static const unsigned short YDC_HT[256][2] = { {0,2},{2,3},{3,3},{4,3},{5,3},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9}};
   static const unsigned short UVDC_HT[256][2] = { {0,2},{1,2},{2,2},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9},{1022,10},{2046,11}};
   static const unsigned short YAC_HT[256][2] = {
      {10,4},{0,2},{1,2},{4,3},{11,4},{26,5},{120,7},{248,8},{1014,10},{65410,16},{65411,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {12,4},{27,5},{121,7},{502,9},{2038,11},{65412,16},{65413,16},{65414,16},{65415,16},{65416,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {28,5},{249,8},{1015,10},{4084,12},{65417,16},{65418,16},{65419,16},{65420,16},{65421,16},{65422,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{503,9},{4085,12},{65423,16},{65424,16},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1016,10},{65430,16},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2039,11},{65438,16},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {123,7},{4086,12},{65446,16},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {250,8},{4087,12},{65454,16},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{32704,15},{65462,16},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65470,16},{65471,16},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65479,16},{65480,16},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1017,10},{65488,16},{65489,16},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{65497,16},{65498,16},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2040,11},{65506,16},{65507,16},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {65515,16},{65516,16},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65525,16},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const unsigned short UVAC_HT[256][2] = {
      {0,2},{1,2},{4,3},{10,4},{24,5},{25,5},{56,6},{120,7},{500,9},{1014,10},{4084,12},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {11,4},{57,6},{246,8},{501,9},{2038,11},{4085,12},{65416,16},{65417,16},{65418,16},{65419,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {26,5},{247,8},{1015,10},{4086,12},{32706,15},{65420,16},{65421,16},{65422,16},{65423,16},{65424,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {27,5},{248,8},{1016,10},{4087,12},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{65430,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{502,9},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{65438,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1017,10},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{65446,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {121,7},{2039,11},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{65454,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2040,11},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{65462,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {249,8},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{65470,16},{65471,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {503,9},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{65479,16},{65480,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{65488,16},{65489,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{65497,16},{65498,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{65506,16},{65507,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{65515,16},{65516,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {16352,14},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{65525,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{32707,15},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const int YQT[] = {16,11,10,16,24,40,51,61,12,12,14,19,26,58,60,55,14,13,16,24,40,57,69,56,14,17,22,29,51,87,80,62,18,22,
                             37,56,68,109,103,77,24,35,55,64,81,104,113,92,49,64,78,87,103,121,120,101,72,92,95,98,112,100,103,99};
   static const int UVQT[] = {17,18,24,47,99,99,99,99,18,21,26,66,99,99,99,99,24,26,56,99,99,99,99,99,47,66,99,99,99,99,99,99,
                              99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99};
   static const float aasf[] = { 1.0f * 2.828427125f, 1.387039845f * 2.828427125f, 1.306562965f * 2.828427125f, 1.175875602f * 2.828427125f,
                                 1.0f * 2.828427125f, 0.785694958f * 2.828427125f, 0.541196100f * 2.828427125f, 0.275899379f * 2.828427125f };

   int row, col, i, k, subsample;
   float fdtbl_Y[64], fdtbl_UV[64];
   unsigned char YTable[64], UVTable[64];

   if(!data || !width || !height || comp > 4 || comp < 1) {
      return 0;
   }

   quality = quality ? quality : 90;
   subsample = quality <= 90 ? 1 : 0;
   quality = quality < 1 ? 1 : quality > 100 ? 100 : quality;
   quality = quality < 50 ? 5000 / quality : 200 - quality * 2;

   for(i = 0; i < 64; ++i) {
      int uvti, yti = (YQT[i]*quality+50)/100;
      YTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (yti < 1 ? 1 : yti > 255 ? 255 : yti);
      uvti = (UVQT[i]*quality+50)/100;
      UVTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (uvti < 1 ? 1 : uvti > 255 ? 255 : uvti);
   }

   for(row = 0, k = 0; row < 8; ++row) {
      for(col = 0; col < 8; ++col, ++k) {
         fdtbl_Y[k]  = 1 / (YTable [stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
         fdtbl_UV[k] = 1 / (UVTable[stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
      }
   }

   // Write Headers
   {
      static const unsigned char head0[] = { 0xFF,0xD8,0xFF,0xE0,0,0x10,'J','F','I','F',0,1,1,0,0,1,0,1,0,0,0xFF,0xDB,0,0x84,0 };
      static const unsigned char head2[] = { 0xFF,0xDA,0,0xC,3,1,0,2,0x11,3,0x11,0,0x3F,0 };
      const unsigned char head1[] = { 0xFF,0xC0,0,0x11,8,(unsigned char)(height>>8),STBIW_UCHAR(height),(unsigned char)(width>>8),STBIW_UCHAR(width),
                                      3,1,(unsigned char)(subsample?0x22:0x11),0,2,0x11,1,3,0x11,1,0xFF,0xC4,0x01,0xA2,0 };
      s->func(s->context, (void*)head0, sizeof(head0));
      s->func(s->context, (void*)YTable, sizeof(YTable));
      stbiw__putc(s, 1);
      s->func(s->context, UVTable, sizeof(UVTable));
      s->func(s->context, (void*)head1, sizeof(head1));
      s->func(s->context, (void*)(std_dc_luminance_nrcodes+1), sizeof(std_dc_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_luminance_values, sizeof(std_dc_luminance_values));
      stbiw__putc(s, 0x10); // HTYACinfo
      s->func(s->context, (void*)(std_ac_luminance_nrcodes+1), sizeof(std_ac_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_luminance_values, sizeof(std_ac_luminance_values));
      stbiw__putc(s, 1); // HTUDCinfo
      s->func(s->context, (void*)(std_dc_chrominance_nrcodes+1), sizeof(std_dc_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_chrominance_values, sizeof(std_dc_chrominance_values));
      stbiw__putc(s, 0x11); // HTUACinfo
      s->func(s->context, (void*)(std_ac_chrominance_nrcodes+1), sizeof(std_ac_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_chrominance_values, sizeof(std_ac_chrominance_values));
      s->func(s->context, (void*)head2, sizeof(head2));
   }

   // Encode 8x8 macroblocks
   {
      static const unsigned short fillBits[] = {0x7F, 7};
      int DCY=0, DCU=0, DCV=0;
      int bitBuf=0, bitCnt=0;
      // comp == 2 is grey+alpha (alpha is ignored)
      int ofsG = comp > 2 ? 1 : 0, ofsB = comp > 2 ? 2 : 0;
      const unsigned char *dataR = (const unsigned char *)data;
      const unsigned char *dataG = dataR + ofsG;
      const unsigned char *dataB = dataR + ofsB;
      int x, y, pos;
      if(subsample) {
         for(y = 0; y < height; y += 16) {
            for(x = 0; x < width; x += 16) {
               float Y[256], U[256], V[256];
               for(row = y, pos = 0; row < y+16; ++row) {
                  // row >= height => use last input row
                  int clamped_row = (row < height) ? row : height - 1;
                  int base_p = (stbi__flip_vertically_on_write ? (height-1-clamped_row) : clamped_row)*width*comp;
                  for(col = x; col < x+16; ++col, ++pos) {
                     // if col >= width => use pixel from last input column
                     int p = base_p + ((col < width) ? col : (width-1))*comp;
                     float r = dataR[p], g = dataG[p], b = dataB[p];
                     Y[pos]= +0.29900f*r + 0.58700f*g + 0.11400f*b - 128;
                     U[pos]= -0.16874f*r - 0.33126f*g + 0.50000f*b;
                     V[pos]= +0.50000f*r - 0.41869f*g - 0.08131f*b;
                  }
               }
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+0,   16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+8,   16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+128, 16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+136, 16, fdtbl_Y, DCY, YDC_HT, YAC_HT);

               // subsample U,V
               {
                  float subU[64], subV[64];
                  int yy, xx;
                  for(yy = 0, pos = 0; yy < 8; ++yy) {
                     for(xx = 0; xx < 8; ++xx, ++pos) {
                        int j = yy*32+xx*2;
                        subU[pos] = (U[j+0] + U[j+1] + U[j+16] + U[j+17]) * 0.25f;
                        subV[pos] = (V[j+0] + V[j+1] + V[j+16] + V[j+17]) * 0.25f;
                     }
                  }
                  DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, subU, 8, fdtbl_UV, DCU, UVDC_HT, UVAC_HT);
                  DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, subV, 8, fdtbl_UV, DCV, UVDC_HT, UVAC_HT);
               }
            }
         }
      } else {
         for(y = 0; y < height; y += 8) {
            for(x = 0; x < width; x += 8) {
               float Y[64], U[64], V[64];
               for(row = y, pos = 0; row < y+8; ++row) {
                  // row >= height => use last input row
                  int clamped_row = (row < height) ? row : height - 1;
                  int base_p = (stbi__flip_vertically_on_write ? (height-1-clamped_row) : clamped_row)*width*comp;
                  for(col = x; col < x+8; ++col, ++pos) {
                     // if col >= width => use pixel from last input column
                     int p = base_p + ((col < width) ? col : (width-1))*comp;
                     float r = dataR[p], g = dataG[p], b = dataB[p];
                     Y[pos]= +0.29900f*r + 0.58700f*g + 0.11400f*b - 128;
                     U[pos]= -0.16874f*r - 0.33126f*g + 0.50000f*b;
                     V[pos]= +0.50000f*r - 0.41869f*g - 0.08131f*b;
                  }
               }

               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y, 8, fdtbl_Y,  DCY, YDC_HT, YAC_HT);
               DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, U, 8, fdtbl_UV, DCU, UVDC_HT, UVAC_HT);
               DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, V, 8, fdtbl_UV, DCV, UVDC_HT, UVAC_HT);
            }
         }
      }

      // Do the bit alignment of the EOI marker
      stbiw__jpg_writeBits(s, &bitBuf, &bitCnt, fillBits);
   }

   // EOI
   stbiw__putc(s, 0xFF);
   stbiw__putc(s, 0xD9);

   return 1;
}